

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.cpp
# Opt level: O0

ShaderResourceDesc __thiscall
Diligent::ShaderResourcesGL::GetResourceDesc(ShaderResourcesGL *this,Uint32 Index)

{
  undefined *puVar1;
  Uint32 UVar2;
  undefined8 uVar3;
  GLResourceAttribs *pGVar4;
  TextureInfo *this_00;
  ImageInfo *this_01;
  Char *Message;
  char (*in_R8) [12];
  undefined1 local_78 [8];
  string msg;
  undefined1 local_48 [8];
  string _msg;
  Uint32 Index_local;
  ShaderResourcesGL *this_local;
  
  _msg.field_2._12_4_ = Index;
  UVar2 = GetVariableCount(this);
  if (Index < UVar2) {
    if ((uint)_msg.field_2._12_4_ < this->m_NumUniformBuffers) {
      pGVar4 = &GetUniformBuffer(this,_msg.field_2._12_4_)->super_GLResourceAttribs;
      _this_local = GLResourceAttribs::GetResourceDesc(pGVar4);
    }
    else {
      _msg.field_2._12_4_ = _msg.field_2._12_4_ - this->m_NumUniformBuffers;
      if ((uint)_msg.field_2._12_4_ < this->m_NumTextures) {
        this_00 = GetTexture(this,_msg.field_2._12_4_);
        _this_local = GLResourceAttribs::GetResourceDesc(&this_00->super_GLResourceAttribs);
      }
      else {
        _msg.field_2._12_4_ = _msg.field_2._12_4_ - this->m_NumTextures;
        if ((uint)_msg.field_2._12_4_ < this->m_NumImages) {
          this_01 = GetImage(this,_msg.field_2._12_4_);
          _this_local = GLResourceAttribs::GetResourceDesc(&this_01->super_GLResourceAttribs);
        }
        else {
          _msg.field_2._12_4_ = _msg.field_2._12_4_ - this->m_NumImages;
          if ((uint)_msg.field_2._12_4_ < this->m_NumStorageBlocks) {
            pGVar4 = &GetStorageBlock(this,_msg.field_2._12_4_)->super_GLResourceAttribs;
            _this_local = GLResourceAttribs::GetResourceDesc(pGVar4);
          }
          else {
            _msg.field_2._12_4_ = _msg.field_2._12_4_ - this->m_NumStorageBlocks;
            FormatString<char[53]>
                      ((string *)local_78,
                       (char (*) [53])"This should never be executed - appears to be a bug.");
            Message = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (Message,"GetResourceDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                       ,0x36f);
            std::__cxx11::string::~string((string *)local_78);
            ShaderResourceDesc::ShaderResourceDesc((ShaderResourceDesc *)&this_local);
          }
        }
      }
    }
  }
  else {
    FormatString<char[16],unsigned_int,char[12]>
              ((string *)local_48,(Diligent *)"Resource index ",
               (char (*) [16])((long)&_msg.field_2 + 0xc),(uint *)0x46bec1,in_R8);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar3 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(2,uVar3,0);
    }
    std::__cxx11::string::~string((string *)local_48);
    ShaderResourceDesc::ShaderResourceDesc((ShaderResourceDesc *)&this_local);
  }
  return _this_local;
}

Assistant:

ShaderResourceDesc ShaderResourcesGL::GetResourceDesc(Uint32 Index) const
{
    if (Index >= GetVariableCount())
    {
        LOG_ERROR_MESSAGE("Resource index ", Index, " is invalid");
        return ShaderResourceDesc{};
    }

    if (Index < m_NumUniformBuffers)
        return GetUniformBuffer(Index).GetResourceDesc();
    else
        Index -= m_NumUniformBuffers;

    if (Index < m_NumTextures)
        return GetTexture(Index).GetResourceDesc();
    else
        Index -= m_NumTextures;

    if (Index < m_NumImages)
        return GetImage(Index).GetResourceDesc();
    else
        Index -= m_NumImages;

    if (Index < m_NumStorageBlocks)
        return GetStorageBlock(Index).GetResourceDesc();
    else
        Index -= m_NumStorageBlocks;

    UNEXPECTED("This should never be executed - appears to be a bug.");
    return ShaderResourceDesc{};
}